

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O0

void __thiscall L16_1::Report::~Report(Report *this)

{
  Report *this_local;
  
  std::operator<<((ostream *)&std::cout,"Object deleted...\n");
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Report() {
            cout << "Object deleted...\n";
        }